

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<ot::commissioner::Address_const&>>,std::tuple<ot::commissioner::Address_const&>>
               (tuple<testing::Matcher<const_ot::commissioner::Address_&>_> *matchers,
               tuple<const_ot::commissioner::Address_&> *values,ostream *os)

{
  Address *value;
  element_type *peVar1;
  int iVar2;
  ostream *poVar3;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<const_ot::commissioner::Address_&> MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<const_ot::commissioner::Address_&>::Matcher
            ((Matcher<const_ot::commissioner::Address_&> *)&MStack_1e8,
             (Matcher<const_ot::commissioner::Address_&> *)matchers);
  value = (values->super__Tuple_impl<0UL,_const_ot::commissioner::Address_&>).
          super__Head_base<0UL,_const_ot::commissioner::Address_&,_false>._M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  iVar2 = (*((MStack_1e8.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (MStack_1e8.impl_.
                     super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,value,&local_1b0);
  if ((char)iVar2 == '\0') {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    peVar1 = (matchers->super__Tuple_impl<0UL,_testing::Matcher<const_ot::commissioner::Address_&>_>
             ).super__Head_base<0UL,_testing::Matcher<const_ot::commissioner::Address_&>,_false>.
             _M_head_impl.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(peVar1,os);
    std::operator<<(os,"\n           Actual: ");
    FallbackPrinter::PrintValue<ot::commissioner::Address>(value,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<const_ot::commissioner::Address_&>::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }